

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void ls_path(string *path_)

{
  ostream *poVar1;
  string *psVar2;
  string *in_R8;
  string local_f0;
  allocator<char> local_c9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c8;
  undefined1 local_a8 [8];
  output o;
  value_type local_58;
  undefined1 local_28 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cmd;
  string *path__local;
  
  cmd.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = path_;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_28);
  poVar1 = std::operator<<((ostream *)&std::cout,"Running: /bin/ls ");
  poVar1 = std::operator<<(poVar1,(string *)
                                  cmd.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"/bin/ls",(allocator<char> *)(o._err.field_2._M_local_buf + 0xf));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_28,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator((allocator<char> *)(o._err.field_2._M_local_buf + 0xf));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_28,
              cmd.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"",&local_c9);
  std::__cxx11::string::string((string *)&local_f0);
  just::process::run<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ((output *)local_a8,(process *)local_28,&local_c8,&local_f0,in_R8);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator(&local_c9);
  poVar1 = std::operator<<((ostream *)&std::cout,"Standard output:");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  psVar2 = just::process::output::standard_output_abi_cxx11_((output *)local_a8);
  poVar1 = std::operator<<(poVar1,(string *)psVar2);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1,"-------------");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1,"Standard error:");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  psVar2 = just::process::output::standard_error_abi_cxx11_((output *)local_a8);
  poVar1 = std::operator<<(poVar1,(string *)psVar2);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1,"-------------");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  just::process::output::~output((output *)local_a8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_28);
  return;
}

Assistant:

void ls_path(const std::string& path_)
{
  using std::cout;
  using std::endl;
  using std::vector;
  using std::string;

  using just::process::output;
  using just::process::run;

  vector<string> cmd;
#ifdef _WIN32
  cout << "Running: dir " << path_ << endl;
  cmd.push_back("c:\\windows\\system32\\cmd.exe");
  cmd.push_back("/c");
  cmd.push_back("dir");
  cmd.push_back(path_);
#else
  cout << "Running: /bin/ls " << path_ << endl;
  cmd.push_back("/bin/ls");
  cmd.push_back(path_);
#endif

  const output o = run(cmd, "");

  cout
    << "Standard output:" << endl
    << o.standard_output() << endl
    << "-------------" << endl
    << "Standard error:" << endl
    << o.standard_error() << endl
    << "-------------" << endl;
}